

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-docstate.c
# Opt level: O0

int fy_document_state_merge(fy_document_state *fyds,fy_document_state *fydsc)

{
  _Bool _Var1;
  int iVar2;
  fy_token *pfVar3;
  fy_token *fyt_td;
  fy_token *fytc_td;
  fy_token *fyt;
  size_t tdc_prefix_size;
  size_t tdc_handle_size;
  size_t td_prefix_size;
  char *tdc_prefix;
  char *tdc_handle;
  char *td_prefix;
  fy_document_state *fydsc_local;
  fy_document_state *fyds_local;
  
  if ((fyds == (fy_document_state *)0x0) || (fydsc == (fy_document_state *)0x0)) {
    fyds_local._4_4_ = -1;
  }
  else {
    td_prefix = (char *)fydsc;
    fydsc_local = fyds;
    for (fyt_td = fy_token_list_first(&fydsc->fyt_td); fyt_td != (fy_token *)0x0;
        fyt_td = fy_token_next((fy_token_list *)(td_prefix + 0x48),fyt_td)) {
      tdc_prefix = fy_tag_directive_token_handle(fyt_td,&tdc_prefix_size);
      if (tdc_prefix == (char *)0x0) {
        return -1;
      }
      td_prefix_size = (size_t)fy_tag_directive_token_prefix(fyt_td,(size_t *)&fyt);
      if ((char *)td_prefix_size == (char *)0x0) {
        return -1;
      }
      pfVar3 = fy_document_state_lookup_tag_directive(fydsc_local,tdc_prefix,tdc_prefix_size);
      if (pfVar3 == (fy_token *)0x0) {
LAB_00159247:
        pfVar3 = fy_token_create(FYTT_TAG_DIRECTIVE,&fyt_td->handle,
                                 (ulong)(fyt_td->field_9).tag_directive.tag_length,
                                 (ulong)(fyt_td->field_9).tag_directive.uri_length);
        if (pfVar3 == (fy_token *)0x0) {
          return -1;
        }
        fy_token_list_add_tail(&fydsc_local->fyt_td,pfVar3);
      }
      else {
        tdc_handle = fy_tag_directive_token_prefix(pfVar3,&tdc_handle_size);
        if (tdc_handle == (char *)0x0) {
          __assert_fail("td_prefix",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-docstate.c"
                        ,0x107,
                        "int fy_document_state_merge(struct fy_document_state *, struct fy_document_state *)"
                       );
        }
        if ((fyt != (fy_token *)tdc_handle_size) ||
           (iVar2 = memcmp((void *)td_prefix_size,tdc_handle,tdc_handle_size), iVar2 != 0)) {
          _Var1 = fy_token_tag_directive_is_overridable(pfVar3);
          if (!_Var1) {
            return -1;
          }
          fy_token_list_del(&fydsc_local->fyt_td,pfVar3);
          fy_token_unref(pfVar3);
          goto LAB_00159247;
        }
      }
    }
    fydsc_local->field_0x1c =
         fydsc_local->field_0x1c & 0xfe |
         ((fydsc_local->field_0x1c & 1) != 0 || (td_prefix[0x1c] & 1U) != 0);
    fydsc_local->field_0x1c =
         fydsc_local->field_0x1c & 0xfd |
         (((byte)fydsc_local->field_0x1c >> 1 & 1) != 0 || ((byte)td_prefix[0x1c] >> 1 & 1) != 0) <<
         1;
    if (((fydsc_local->version).major < *(int *)(td_prefix + 0x14)) ||
       (((fydsc_local->version).major == *(int *)(td_prefix + 0x14) &&
        ((fydsc_local->version).minor < *(int *)(td_prefix + 0x18))))) {
      fydsc_local->version = *(fy_version *)(td_prefix + 0x14);
    }
    fyds_local._4_4_ = 0;
  }
  return fyds_local._4_4_;
}

Assistant:

int fy_document_state_merge(struct fy_document_state *fyds,
                            struct fy_document_state *fydsc) {
    const char *td_prefix, *tdc_handle, *tdc_prefix;
    size_t td_prefix_size, tdc_handle_size, tdc_prefix_size;
    struct fy_token *fyt, *fytc_td, *fyt_td;

    if (!fyds || !fydsc)
        return -1;

    /* check if there's a duplicate handle (which differs */
    for (fytc_td = fy_token_list_first(&fydsc->fyt_td); fytc_td;
         fytc_td = fy_token_next(&fydsc->fyt_td, fytc_td)) {

        tdc_handle = fy_tag_directive_token_handle(fytc_td, &tdc_handle_size);
        if (!tdc_handle)
            goto err_out;
        tdc_prefix = fy_tag_directive_token_prefix(fytc_td, &tdc_prefix_size);
        if (!tdc_prefix)
            goto err_out;

        fyt_td = fy_document_state_lookup_tag_directive(fyds, tdc_handle, tdc_handle_size);
        if (fyt_td) {
            /* exists, must check whether the prefixes match */
            td_prefix = fy_tag_directive_token_prefix(fyt_td, &td_prefix_size);
            assert(td_prefix);

            /* match? do nothing */
            if (tdc_prefix_size == td_prefix_size &&
                !memcmp(tdc_prefix, td_prefix, td_prefix_size))
                continue;

            if (!fy_token_tag_directive_is_overridable(fyt_td))
                goto err_out;

            /* override tag directive */
            fy_token_list_del(&fyds->fyt_td, fyt_td);
            fy_token_unref(fyt_td);
        }

        fyt = fy_token_create(FYTT_TAG_DIRECTIVE,
                              &fytc_td->handle,
                              fytc_td->tag_directive.tag_length,
                              fytc_td->tag_directive.uri_length);
        if (!fyt)
            goto err_out;

        fy_token_list_add_tail(&fyds->fyt_td, fyt);
    }

    /* merge other document state */
    fyds->version_explicit |= fydsc->version_explicit;
    fyds->tags_explicit |= fydsc->tags_explicit;

    if (fyds->version.major < fydsc->version.major ||
        (fyds->version.major == fydsc->version.major &&
         fyds->version.minor < fydsc->version.minor))
        fyds->version = fydsc->version;

    return 0;

    err_out:
    return -1;
}